

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  int r;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  pvVar1 = opendir_req.ptr;
  if (req != &opendir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x146,"req == &opendir_req");
    abort();
  }
  if (opendir_req.fs_type != UV_FS_OPENDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x147,"req->fs_type == UV_FS_OPENDIR");
    abort();
  }
  if (opendir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x148,"req->result == 0");
    abort();
  }
  if (opendir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x149,"req->ptr != NULL");
    abort();
  }
  *(uv_dirent_t **)opendir_req.ptr = dirents;
  *(undefined8 *)((long)pvVar1 + 8) = 1;
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,non_empty_readdir_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x153,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
  return;
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT(r == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}